

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joint.cpp
# Opt level: O0

Matrix4x4 * __thiscall CMU462::DynamicScene::Joint::getBindTransformation(Joint *this)

{
  long in_RSI;
  Matrix4x4 *in_RDI;
  Joint *j;
  Matrix4x4 *T;
  Vector3D *in_stack_fffffffffffffdc8;
  Matrix4x4 *in_stack_fffffffffffffdd0;
  Matrix4x4 *in_stack_fffffffffffffdd8;
  undefined1 local_1b0 [128];
  Vector3D local_130 [6];
  undefined1 local_98 [128];
  long local_18;
  
  Matrix4x4::identity();
  for (local_18 = *(long *)(in_RSI + 0x148); local_18 != 0; local_18 = *(long *)(local_18 + 0x148))
  {
    Vector3D::Vector3D(local_130,(Vector3D *)(local_18 + 0x108));
    Matrix4x4::translation(in_stack_fffffffffffffdc8);
    Matrix4x4::operator*(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    memcpy(in_RDI,local_98,0x80);
  }
  Vector3D::Vector3D((Vector3D *)&stack0xfffffffffffffdb8,
                     (Vector3D *)(*(long *)(*(long *)(in_RSI + 0x140) + 0xf8) + 0x10));
  Matrix4x4::translation(in_stack_fffffffffffffdc8);
  Matrix4x4::operator*(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  memcpy(in_RDI,local_1b0,0x80);
  return in_RDI;
}

Assistant:

Matrix4x4 Joint::getBindTransformation() {
  Matrix4x4 T = Matrix4x4::identity();
  for (Joint* j = parent; j != nullptr; j = j->parent) {
    T = Matrix4x4::translation(j->axis) * T;
  }

  // Allow skeleton translation by taking root's position into account
  T = Matrix4x4::translation(skeleton->root->position) * T;

  return T;
}